

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledInputFile::initialize(TiledInputFile *this)

{
  bool bVar1;
  ArgExc *pAVar2;
  TileDescription *pTVar3;
  LineOrder *pLVar4;
  Box2i *pBVar5;
  long lVar6;
  size_t sVar7;
  size_type sVar8;
  TileBuffer *this_00;
  Compressor *comp;
  reference ppTVar9;
  ulong uVar10;
  char *pcVar11;
  long in_RDI;
  TileOffsets *this_01;
  TileOffsets *numXTiles;
  size_t i;
  Box2i *dataWindow;
  string *in_stack_000000e8;
  Header *in_stack_000000f0;
  undefined1 in_stack_00001a2e;
  undefined1 in_stack_00001a2f;
  Header *in_stack_00001a30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  Header *in_stack_ffffffffffffff70;
  int **in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  size_type sVar12;
  Header *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  LevelMode in_stack_ffffffffffffffcc;
  TileOffsets *in_stack_ffffffffffffffd0;
  size_type local_18;
  
  bVar1 = isMultiPart(*(int *)(*(long *)(in_RDI + 8) + 0x70));
  if ((((!bVar1) && (bVar1 = isNonImage(*(int *)(*(long *)(in_RDI + 8) + 0x70)), !bVar1)) &&
      (bVar1 = isTiled(*(int *)(*(long *)(in_RDI + 8) + 0x70)), bVar1)) &&
     (bVar1 = Header::hasType((Header *)0x1992ea), bVar1)) {
    Header::setType(in_stack_000000f0,in_stack_000000e8);
  }
  if (*(int *)(*(long *)(in_RDI + 8) + 0x130) == -1) {
    bVar1 = isTiled(*(int *)(*(long *)(in_RDI + 8) + 0x70));
    if (!bVar1) {
      pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(pAVar2,"Expected a tiled file but the file is not tiled.");
      __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  else {
    bVar1 = Header::hasType((Header *)0x19937a);
    if (bVar1) {
      Header::type_abi_cxx11_((Header *)0x199392);
      bVar1 = std::operator!=(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      if (bVar1) {
        pAVar2 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::ArgExc::ArgExc(pAVar2,"TiledInputFile used for non-tiledimage part.");
        __cxa_throw(pAVar2,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
      }
    }
  }
  Header::sanityCheck(in_stack_00001a30,(bool)in_stack_00001a2f,(bool)in_stack_00001a2e);
  pTVar3 = Header::tileDescription((Header *)0x19940a);
  lVar6 = *(long *)(in_RDI + 8);
  *(undefined8 *)(lVar6 + 0x60) = *(undefined8 *)pTVar3;
  *(undefined8 *)(lVar6 + 0x68) = *(undefined8 *)&pTVar3->mode;
  pLVar4 = Header::lineOrder((Header *)0x199432);
  *(LineOrder *)(*(long *)(in_RDI + 8) + 0xa8) = *pLVar4;
  pBVar5 = Header::dataWindow((Header *)0x199453);
  *(int *)(*(long *)(in_RDI + 8) + 0xac) = (pBVar5->min).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xb0) = (pBVar5->max).x;
  *(int *)(*(long *)(in_RDI + 8) + 0xb4) = (pBVar5->min).y;
  *(int *)(*(long *)(in_RDI + 8) + 0xb8) = (pBVar5->max).y;
  numXTiles = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xd0);
  this_01 = (TileOffsets *)(*(long *)(in_RDI + 8) + 0xbc);
  lVar6 = *(long *)(in_RDI + 8) + 0xc0;
  precalculateTileInfo
            ((TileDescription *)in_stack_ffffffffffffff70,(int)((ulong)lVar6 >> 0x20),(int)lVar6,
             (int)((ulong)this_01 >> 0x20),(int)this_01,(int **)numXTiles,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  sVar7 = calculateBytesPerPixel(in_stack_ffffffffffffff70);
  *(size_t *)(*(long *)(in_RDI + 8) + 0x120) = sVar7;
  *(ulong *)(*(long *)(in_RDI + 8) + 0x128) =
       *(long *)(*(long *)(in_RDI + 8) + 0x120) * (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x60);
  *(ulong *)(*(long *)(in_RDI + 8) + 0x160) =
       *(long *)(*(long *)(in_RDI + 8) + 0x128) * (ulong)*(uint *)(*(long *)(in_RDI + 8) + 100);
  local_18 = 0;
  while (sVar12 = local_18,
        sVar8 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                        *)(*(long *)(in_RDI + 8) + 0x148)), sVar12 < sVar8) {
    this_00 = (TileBuffer *)operator_new(0x80);
    Header::compression((Header *)0x1995ef);
    comp = newTileCompressor(in_stack_ffffffffffffffcc,
                             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (size_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    anon_unknown_8::TileBuffer::TileBuffer(this_00,comp);
    ppTVar9 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(*(long *)(in_RDI + 8) + 0x148),local_18);
    *ppTVar9 = this_00;
    uVar10 = (**(code **)(**(long **)(*(long *)(*(long *)(in_RDI + 8) + 0x170) + 0x28) + 0x10))();
    if ((uVar10 & 1) == 0) {
      pcVar11 = (char *)operator_new__(*(ulong *)(*(long *)(in_RDI + 8) + 0x160));
      ppTVar9 = std::
                vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                              *)(*(long *)(in_RDI + 8) + 0x148),local_18);
      (*ppTVar9)->buffer = pcVar11;
    }
    local_18 = local_18 + 1;
  }
  TileOffsets::TileOffsets
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0);
  TileOffsets::operator=(this_01,numXTiles);
  TileOffsets::~TileOffsets((TileOffsets *)0x199768);
  return;
}

Assistant:

void
TiledInputFile::initialize ()
{
    // fix bad types in header (arises when a tool built against an older version of
    // OpenEXR converts a scanline image to tiled)
    // only applies when file is a single part, regular image, tiled file
    //
    if(!isMultiPart(_data->version) &&
       !isNonImage(_data->version) && 
       isTiled(_data->version) && 
       _data->header.hasType() )
    {
        _data->header.setType(TILEDIMAGE);
    }
    
    if (_data->partNumber == -1)
    {
        if (!isTiled (_data->version))
            throw IEX_NAMESPACE::ArgExc ("Expected a tiled file but the file is not tiled.");
        
    }
    else
    {
        if(_data->header.hasType() && _data->header.type()!=TILEDIMAGE)
        {
            throw IEX_NAMESPACE::ArgExc ("TiledInputFile used for non-tiledimage part.");
        }
    }
    
    _data->header.sanityCheck (true);

    _data->tileDesc = _data->header.tileDescription();
    _data->lineOrder = _data->header.lineOrder();

    //
    // Save the dataWindow information
    //
    
    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);    

    _data->bytesPerPixel = calculateBytesPerPixel (_data->header);

    _data->maxBytesPerTileLine = _data->bytesPerPixel * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;

    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        if (!_data->_streamData->is->isMemoryMapped ())
            _data->tileBuffers[i]->buffer = new char [_data->tileBufferSize];
    }

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}